

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall
args::FlagBase::GetNameString_abi_cxx11_
          (string *__return_storage_ptr__,FlagBase *this,HelpParams *params)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_type sVar4;
  string *local_158;
  bool local_14a;
  bool local_149;
  string *local_148;
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  __normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
  local_e0;
  __normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
  local_d8;
  string local_d0;
  __normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
  local_b0;
  reference local_a8;
  EitherFlag *flag;
  __normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
  local_98;
  const_iterator it;
  bool useValueNameOnce;
  undefined1 local_80 [8];
  vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> flagStrings;
  Nargs local_60;
  Nargs local_50;
  undefined1 local_40 [8];
  string postfix;
  HelpParams *params_local;
  FlagBase *this_local;
  string *flags;
  
  postfix.field_2._8_8_ = params;
  if ((params->showValueName & 1U) != 0) {
    iVar2 = (*(this->super_NamedBase).super_Base._vptr_Base[0x13])();
    local_50.min = CONCAT44(extraout_var,iVar2);
    Nargs::Nargs(&local_60,0);
    bVar1 = operator==(&local_50,&local_60);
    if (!bVar1) {
      (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(local_40);
      goto LAB_00121517;
    }
  }
  std::__cxx11::string::string((string *)local_40);
LAB_00121517:
  flagStrings.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  Matcher::GetFlagStrings
            ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_80,&this->matcher)
  ;
  sVar4 = std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::size
                    ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_80);
  if (sVar4 == 1) {
    local_139 = 0;
  }
  else {
    local_139 = *(byte *)(postfix.field_2._8_8_ + 0x218);
  }
  it._M_current._3_1_ = local_139 & 1;
  local_98._M_current =
       (EitherFlag *)
       std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::begin
                 ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_80);
  while( true ) {
    flag = (EitherFlag *)
           std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::end
                     ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_80);
    bVar1 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
                        *)&flag);
    if (!bVar1) break;
    local_a8 = __gnu_cxx::
               __normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
               ::operator*(&local_98);
    local_b0._M_current =
         (EitherFlag *)
         std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::begin
                   ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_80);
    bVar1 = __gnu_cxx::operator!=(&local_98,&local_b0);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    if ((local_a8->isShort & 1U) == 0) {
      local_148 = (string *)(postfix.field_2._8_8_ + 0x48);
    }
    else {
      local_148 = (string *)(postfix.field_2._8_8_ + 0x28);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_148);
    EitherFlag::str_abi_cxx11_(&local_d0,local_a8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    uVar3 = std::__cxx11::string::empty();
    local_149 = false;
    if ((uVar3 & 1) == 0) {
      local_14a = true;
      if ((it._M_current._3_1_ & 1) != 0) {
        local_d8 = __gnu_cxx::
                   __normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
                   ::operator+(&local_98,1);
        local_e0._M_current =
             (EitherFlag *)
             std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::end
                       ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_80);
        local_14a = __gnu_cxx::operator==(&local_d8,&local_e0);
      }
      local_149 = local_14a;
    }
    if (local_149 != false) {
      if ((local_a8->isShort & 1U) == 0) {
        local_158 = (string *)(postfix.field_2._8_8_ + 0x88);
      }
      else {
        local_158 = (string *)(postfix.field_2._8_8_ + 0x68);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_158);
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 0x220),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 0x240));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    __gnu_cxx::
    __normal_iterator<const_args::EitherFlag_*,_std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>_>
    ::operator++(&local_98);
  }
  flagStrings.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::~vector
            ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_80);
  if ((flagStrings.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetNameString(const HelpParams &params) const override
            {
                const std::string postfix = !params.showValueName || NumberOfArguments() == 0 ? std::string() : Name();
                std::string flags;
                const auto flagStrings = matcher.GetFlagStrings();
                const bool useValueNameOnce = flagStrings.size() == 1 ? false : params.useValueNameOnce;
                for (auto it = flagStrings.begin(); it != flagStrings.end(); ++it)
                {
                    auto &flag = *it;
                    if (it != flagStrings.begin())
                    {
                        flags += ", ";
                    }

                    flags += flag.isShort ? params.shortPrefix : params.longPrefix;
                    flags += flag.str();

                    if (!postfix.empty() && (!useValueNameOnce || it + 1 == flagStrings.end()))
                    {
                        flags += flag.isShort ? params.shortSeparator : params.longSeparator;
                        flags += params.valueOpen + postfix + params.valueClose;
                    }
                }

                return flags;
            }